

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

Operand __thiscall flow::TargetCodeGenerator::getConstantInt(TargetCodeGenerator *this,Value *value)

{
  _Map_pointer pppVVar1;
  _Elt_pointer ppVVar2;
  FILE *pFVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  long *extraout_RAX;
  Value **ppVVar7;
  ulong uVar8;
  Value *unaff_RBX;
  long lVar9;
  long lVar10;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  long *plStack_290;
  undefined8 uStack_288;
  long alStack_280 [2];
  long alStack_270 [2];
  long *plStack_260;
  undefined8 uStack_258;
  undefined **ppuStack_250;
  undefined1 *puStack_248;
  size_t sStack_240;
  ulong uStack_238;
  undefined1 auStack_230 [504];
  Value *pVStack_38;
  
  pVStack_38 = unaff_RBX;
  if (value != (Value *)0x0) {
    this = (TargetCodeGenerator *)value;
    lVar4 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    pVStack_38 = value;
    if (lVar4 != 0) {
      return *(Operand *)&value[1]._vptr_Value;
    }
  }
  getConstantInt();
  pFVar3 = _stdout;
  pppVVar1 = (this->stack_).
             super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  alStack_270[0] =
       ((long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last -
        (long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur >> 3) +
       ((long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur -
        (long)(this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first >> 3) +
       ((((ulong)((long)pppVVar1 -
                 (long)(this->stack_).
                       super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
       (ulong)(pppVVar1 == (_Map_pointer)0x0)) * 0x40;
  sStack_240 = 0;
  ppuStack_250 = &PTR_grow_001934a0;
  uStack_238 = 500;
  format_str.size_ = 0x20;
  format_str.data_ = "Dump stack state ({} elements):\n";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)alStack_270;
  args.types_ = 5;
  puStack_248 = auStack_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&ppuStack_250,format_str,args);
  fwrite(puStack_248,1,sStack_240,pFVar3);
  ppuStack_250 = &PTR_grow_001934a0;
  if (puStack_248 != auStack_230) {
    operator_delete(puStack_248,uStack_238);
  }
  pppVVar1 = (this->stack_).
             super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  plVar5 = (long *)(((((ulong)((long)pppVVar1 -
                              (long)(this->stack_).
                                    super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                    (ulong)(pppVVar1 == (_Map_pointer)0x0)) * 0x40);
  lVar4 = (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_cur -
          (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first >> 3;
  lVar9 = (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_last -
          (long)(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur >> 3;
  if ((long)plVar5 + lVar9 + lVar4 != 0) {
    lVar4 = lVar9 + lVar4 + (long)plVar5;
    lVar9 = 0;
    lVar10 = 0;
    do {
      ppVVar2 = (this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur;
      uVar6 = ((long)ppVVar2 -
               (long)(this->stack_).
                     super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + lVar10;
      if ((long)uVar6 < 0) {
        uVar8 = (long)uVar6 >> 6;
LAB_00137a4f:
        ppVVar7 = (this->stack_).
                  super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node[uVar8] + uVar6 + uVar8 * -0x40;
      }
      else {
        if (0x3f < uVar6) {
          uVar8 = uVar6 >> 6;
          goto LAB_00137a4f;
        }
        ppVVar7 = (Value **)((long)ppVVar2 + lVar9);
      }
      (*(*ppVVar7)->_vptr_Value[2])(&plStack_290);
      pFVar3 = _stdout;
      plStack_260 = plStack_290;
      uStack_258 = uStack_288;
      sStack_240 = 0;
      ppuStack_250 = &PTR_grow_001934a0;
      uStack_238 = 500;
      format_str_00.size_ = 0xe;
      format_str_00.data_ = "stack[{}]: {}\n";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)alStack_270;
      args_00.types_ = 0xb5;
      alStack_270[0] = lVar10;
      puStack_248 = auStack_230;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&ppuStack_250,format_str_00,args_00);
      fwrite(puStack_248,1,sStack_240,pFVar3);
      ppuStack_250 = &PTR_grow_001934a0;
      if (puStack_248 != auStack_230) {
        operator_delete(puStack_248,uStack_238);
      }
      plVar5 = alStack_280;
      if (plStack_290 != plVar5) {
        operator_delete(plStack_290,alStack_280[0] + 1);
        plVar5 = extraout_RAX;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar4 != lVar10);
  }
  return (Operand)plVar5;
}

Assistant:

Operand TargetCodeGenerator::getConstantInt(Value* value) {
  FLOW_ASSERT(dynamic_cast<ConstantInt*>(value) != nullptr, "Must be ConstantInt");
  return static_cast<ConstantInt*>(value)->get();
}